

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VWAP.cpp
# Opt level: O3

double __thiscall VWAPOption::simulateSinglePath(VWAPOption *this)

{
  double dVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  int iVar4;
  VWAPOption *this_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  mt19937 gen;
  double local_13d8;
  double local_13c8;
  double local_13c0;
  double local_13b8;
  mt19937 local_13a0;
  
  uVar2 = 0xffffff95;
  local_13a0._M_x[0] = 0xffffff95;
  lVar3 = 1;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_13a0._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13a0._M_p = 0x270;
  local_13b8 = this->S0_;
  local_13d8 = this->X0_;
  local_13c0 = local_13b8 * local_13d8 * local_13d8;
  local_13c8 = local_13d8 * local_13d8;
  dVar1 = this->a_;
  this_00 = this;
  dVar5 = exp(-this->lambda_ * this->delta_);
  dVar10 = this->lambda_;
  dVar9 = this->sigmaVol_;
  dVar6 = exp(dVar10 * -2.0 * this->delta_);
  if (0 < this->numIncrements_) {
    dVar10 = (1.0 - dVar6) * ((dVar9 * dVar9) / (dVar10 + dVar10));
    iVar4 = 0;
    do {
      dVar9 = this->sigmaPrice_;
      dVar6 = this->delta_;
      dVar8 = this->mu_;
      if (dVar6 < 0.0) {
        dVar7 = sqrt(dVar6);
      }
      else {
        dVar7 = SQRT(dVar6);
      }
      dVar6 = exp((dVar9 * -0.5 * dVar9 + dVar8) * dVar6 + dVar9 * dVar7);
      dVar8 = GetNormDistrDouble(this_00,&local_13a0);
      dVar7 = exp(-this->lambda_ * this->delta_);
      dVar9 = SQRT(dVar10);
      if (dVar10 < 0.0) {
        dVar9 = sqrt(dVar10);
      }
      local_13b8 = local_13b8 * dVar6 * dVar8;
      dVar6 = GetNormDistrDouble(this_00,&local_13a0);
      local_13d8 = local_13d8 * dVar7 + dVar1 * (1.0 - dVar5) + dVar6 * dVar9;
      local_13c0 = local_13c0 + local_13b8 * local_13d8 * local_13d8;
      local_13c8 = local_13c8 + local_13d8 * local_13d8;
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->numIncrements_);
  }
  return local_13c0 / local_13c8;
}

Assistant:

double VWAPOption::simulateSinglePath() {
    int seed = -107;
    std::mt19937 gen(seed);

    double sumStUt = S0_*X0_*X0_;
    double sumUt   = X0_*X0_;

    double Sti = S0_;
    double Xti = X0_;
    double Uti = 0.0;
    const double muX = a_*(1-exp(-lambda_ * delta_));
    const double sigmaX2 = pow(sigmaVol_,2)/(2*lambda_)*(1-exp(-2*lambda_*delta_));

    //simulate path over [0,T]
    for (int i = 1; i <= numIncrements_; i++) {
        Sti = Sti*exp((mu_-0.5*sigmaPrice_*sigmaPrice_)*delta_
                      + sigmaPrice_*sqrt(delta_))*GetNormDistrDouble(gen);

        Xti = exp(-lambda_*delta_)*Xti + muX + sqrt(sigmaX2)*GetNormDistrDouble(gen);
        Uti = pow(Xti,2);

        sumStUt+= Sti*Uti;
        sumUt += Uti;
    }

    return (sumStUt/sumUt);
}